

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.cpp
# Opt level: O3

string * __thiscall
duckdb::Bit::BlobToBit_abi_cxx11_(string *__return_storage_ptr__,Bit *this,string_t blob)

{
  ulong uVar1;
  undefined4 *__src;
  undefined4 *puVar2;
  undefined4 *puVar3;
  void *__src_00;
  undefined4 *__dest;
  uint uVar4;
  undefined4 local_4c;
  undefined4 uStack_48;
  undefined4 local_44;
  undefined8 local_40;
  void *local_38;
  
  uVar1 = ((ulong)this & 0xffffffff) + 1;
  __src = (undefined4 *)operator_new__(uVar1);
  __dest = &local_4c;
  uVar4 = (uint)uVar1;
  if (uVar4 < 0xd) {
    local_44 = 0;
    local_4c = 0;
    uStack_48 = 0;
    puVar3 = __dest;
    if (uVar4 == 0) {
      puVar2 = (undefined4 *)0x0;
    }
    else {
      switchD_012b9b0d::default(__dest,__src,(ulong)(uVar4 & 0xf));
      puVar2 = (undefined4 *)CONCAT44(local_44,uStack_48);
    }
  }
  else {
    uStack_48 = SUB84(__src,0);
    local_44 = (undefined4)((ulong)__src >> 0x20);
    puVar2 = __src;
    puVar3 = __src;
  }
  __src_00 = blob.value._0_8_;
  if ((uint)this < 0xd) {
    __src_00 = (void *)((long)&local_40 + 4);
  }
  local_40 = this;
  local_38 = blob.value._0_8_;
  *(undefined1 *)puVar3 = 0;
  puVar3 = &local_4c;
  if (0xc < uVar4) {
    puVar3 = puVar2;
  }
  switchD_012b9b0d::default((undefined1 *)((long)puVar3 + 1),__src_00,(ulong)this & 0xffffffff);
  if (0xc < uVar4) {
    __dest = (undefined4 *)CONCAT44(local_44,uStack_48);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,__dest,
             (undefined1 *)((uVar1 & 0xffffffff) + (long)__dest));
  operator_delete__(__src);
  return __return_storage_ptr__;
}

Assistant:

string Bit::BlobToBit(string_t blob) {
	auto buffer = make_unsafe_uniq_array_uninitialized<char>(blob.GetSize() + 1);
	bitstring_t output_str(buffer.get(), UnsafeNumericCast<uint32_t>(blob.GetSize() + 1));
	Bit::BlobToBit(blob, output_str);
	return output_str.GetString();
}